

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

ostream * despot::operator<<(ostream *os,Variable *var)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Values:",7);
  if ((var->values_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (var->values_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
      pbVar1 = (var->values_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,pbVar1[uVar4]._M_dataplus._M_p,pbVar1[uVar4]._M_string_length);
      bVar2 = uVar5 < (ulong)((long)(var->values_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(var->values_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  std::ios::widen((char)os->_vptr_basic_ostream[-3] + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Variable& var) {
	os << "Values:";
	for (unsigned int i = 0; i < var.values_.size(); i++) {
		os << " " << i << "=" << var.values_[i];
	}
	os << endl;
	return os;
}